

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pass2.cpp
# Opt level: O1

uchar * __thiscall cs222::Pass2::string_to_hex(Pass2 *this,char *str,long *len)

{
  long lVar1;
  long lVar2;
  
  lVar1 = len[1];
  (this->modificationAddresses).super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Deque_impl_data._M_map =
       &(this->modificationAddresses).
        super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Deque_impl_data._M_start._M_cur;
  (this->modificationAddresses).super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Deque_impl_data._M_map_size = 0;
  *(undefined1 *)
   &(this->modificationAddresses).super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
    _M_impl.super__Deque_impl_data._M_start._M_cur = 0;
  std::__cxx11::string::reserve((ulong)this);
  if (lVar1 != 0) {
    lVar2 = 0;
    do {
      std::__cxx11::string::push_back((char)this);
      std::__cxx11::string::push_back((char)this);
      lVar2 = lVar2 + 1;
    } while (lVar1 != lVar2);
  }
  return (uchar *)this;
}

Assistant:

std::string Pass2::string_to_hex(const std::string& input)
    {
        static const char* const lut = "0123456789ABCDEF";
        size_t len = input.length();

        std::string output;
        output.reserve(2 * len);
        for (size_t i = 0; i < len; ++i)
        {
            const unsigned char c = input[i];
            output.push_back(lut[c >> 4]);
            output.push_back(lut[c & 15]);
        }
        return output;
    }